

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# where_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::WhereBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,WhereBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  bool bVar4;
  pointer pcVar5;
  size_type *psVar6;
  undefined1 local_140 [136];
  undefined1 local_b8 [136];
  
  ExpressionBinder::BindExpression
            ((BindResult *)local_140,&this->super_ExpressionBinder,expr_ptr,depth,false);
  if (((bool)local_140[8] == true) && ((this->column_alias_binder).ptr != (ColumnAliasBinder *)0x0))
  {
    BindResult::BindResult((BindResult *)local_b8);
    optional_ptr<duckdb::ColumnAliasBinder,_true>::CheckValid(&this->column_alias_binder);
    bVar4 = ColumnAliasBinder::BindAlias
                      ((this->column_alias_binder).ptr,&this->super_ExpressionBinder,expr_ptr,depth,
                       root_expression,(BindResult *)local_b8);
    if (bVar4) {
      (__return_storage_ptr__->expression).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)local_b8._0_8_;
      local_b8._0_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      (__return_storage_ptr__->error).initialized = (bool)local_b8[8];
      (__return_storage_ptr__->error).type = local_b8[9];
      paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
      if ((undefined1 *)local_b8._16_8_ == local_b8 + 0x20) {
        paVar1->_M_allocated_capacity = CONCAT71(local_b8._33_7_,local_b8[0x20]);
        *(undefined8 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
             local_b8._40_8_;
      }
      else {
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_b8._16_8_;
        (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
             CONCAT71(local_b8._33_7_,local_b8[0x20]);
      }
      pcVar5 = local_b8 + 0x40;
      (__return_storage_ptr__->error).raw_message._M_string_length = local_b8._24_8_;
      local_b8._16_8_ = local_b8 + 0x20;
      local_b8._24_8_ = 0;
      local_b8[0x20] = '\0';
      paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
      if ((pointer)local_b8._48_8_ == pcVar5) {
        paVar1->_M_allocated_capacity = local_b8._64_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
             local_b8._72_8_;
      }
      else {
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_b8._48_8_;
        (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
             local_b8._64_8_;
      }
      puVar2 = local_b8;
      puVar3 = local_b8;
    }
    else {
      (__return_storage_ptr__->expression).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)local_140._0_8_;
      local_140._0_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      (__return_storage_ptr__->error).initialized = (bool)local_140[8];
      (__return_storage_ptr__->error).type = local_140[9];
      paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
      if ((undefined1 *)local_140._16_8_ == local_140 + 0x20) {
        paVar1->_M_allocated_capacity = CONCAT44(local_140._36_4_,local_140._32_4_);
        *(ulong *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
             CONCAT44(local_140._44_4_,local_140._40_4_);
      }
      else {
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_140._16_8_;
        (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
             CONCAT44(local_140._36_4_,local_140._32_4_);
      }
      pcVar5 = local_140 + 0x40;
      (__return_storage_ptr__->error).raw_message._M_string_length = local_140._24_8_;
      local_140._24_8_ = 0;
      local_140._32_4_ = local_140._32_4_ & 0xffffff00;
      paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
      if ((pointer)local_140._48_8_ == pcVar5) {
        paVar1->_M_allocated_capacity = CONCAT44(local_140._68_4_,local_140._64_4_);
        *(ulong *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
             CONCAT44(local_140._76_4_,local_140._72_4_);
      }
      else {
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_140._48_8_;
        (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
             CONCAT44(local_140._68_4_,local_140._64_4_);
      }
      puVar2 = local_140;
      puVar3 = local_140;
      local_140._16_8_ = local_140 + 0x20;
    }
    psVar6 = (size_type *)(puVar3 + 0x38);
    (__return_storage_ptr__->error).final_message._M_string_length = *psVar6;
    psVar6[-1] = (size_type)pcVar5;
    *psVar6 = 0;
    *pcVar5 = '\0';
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(__return_storage_ptr__->error).extra_info,puVar2 + 0x50);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b8 + 0x50));
    if ((undefined1 *)local_b8._48_8_ != local_b8 + 0x40) {
      operator_delete((void *)local_b8._48_8_);
    }
    if ((undefined1 *)local_b8._16_8_ != local_b8 + 0x20) {
      operator_delete((void *)local_b8._16_8_);
    }
    if ((Expression *)local_b8._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_b8._0_8_)->_vptr_BaseExpression[1])();
    }
  }
  else {
    (__return_storage_ptr__->expression).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false> =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)local_140._0_8_;
    local_140._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    (__return_storage_ptr__->error).initialized = (bool)local_140[8];
    (__return_storage_ptr__->error).type = local_140[9];
    paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
    if ((undefined1 *)local_140._16_8_ == local_140 + 0x20) {
      *(undefined4 *)paVar1 = local_140._32_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
           local_140._36_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
           local_140._40_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
           local_140._44_4_;
    }
    else {
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_140._16_8_;
      (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
           CONCAT44(local_140._36_4_,local_140._32_4_);
    }
    (__return_storage_ptr__->error).raw_message._M_string_length = local_140._24_8_;
    local_140._24_8_ = 0;
    local_140._32_4_ = local_140._32_4_ & 0xffffff00;
    paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
    if ((undefined1 *)local_140._48_8_ == local_140 + 0x40) {
      *(undefined4 *)paVar1 = local_140._64_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
           local_140._68_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
           local_140._72_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
           local_140._76_4_;
    }
    else {
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_140._48_8_;
      (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
           CONCAT44(local_140._68_4_,local_140._64_4_);
    }
    (__return_storage_ptr__->error).final_message._M_string_length = local_140._56_8_;
    local_140._56_8_ = 0;
    local_140._64_4_ = local_140._64_4_ & 0xffffff00;
    local_140._16_8_ = local_140 + 0x20;
    local_140._48_8_ = local_140 + 0x40;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(__return_storage_ptr__->error).extra_info,local_140 + 0x50);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_140 + 0x50));
  if ((undefined1 *)local_140._48_8_ != local_140 + 0x40) {
    operator_delete((void *)local_140._48_8_);
  }
  if ((undefined1 *)local_140._16_8_ != local_140 + 0x20) {
    operator_delete((void *)local_140._16_8_);
  }
  if ((Expression *)local_140._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_140._0_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult WhereBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {

	auto result = ExpressionBinder::BindExpression(expr_ptr, depth);
	if (!result.HasError() || !column_alias_binder) {
		return result;
	}

	BindResult alias_result;
	auto found_alias = column_alias_binder->BindAlias(*this, expr_ptr, depth, root_expression, alias_result);
	if (found_alias) {
		return alias_result;
	}

	return result;
}